

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O1

void pulse_prog_phantasm(CHAR_DATA *mob)

{
  CHAR_DATA *ch;
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *name;
  
  ch = mob->fighting;
  if (ch != (CHAR_DATA *)0x0) {
    iVar2 = number_percent();
    if (iVar2 < 0xb) {
      name = (char *)0x0;
      iVar2 = number_range(0,5);
      if (iVar2 - 1U < 3) {
        bVar1 = false;
        act("Your death flashes before your eyes.",(CHAR_DATA *)0x0,(void *)0x0,ch,2);
        act("You feel hope slip away.",(CHAR_DATA *)0x0,(void *)0x0,ch,2);
        act("$N gets a look of hopelessness on $S face.",mob,(void *)0x0,ch,1);
        name = "curse";
      }
      else if (iVar2 - 4U < 2) {
        bVar1 = false;
        act("$n runs $s fingers down $N\'s face gently.",mob,(void *)0x0,ch,1);
        act("$n runs $s fingers down your face gently.",mob,(void *)0x0,ch,2);
        act("$n plunges $s spectral hand into $N\'s head, leaving $M looking confused.",mob,
            (void *)0x0,ch,1);
        act("$n plunges $s spectral hand into your head, leaving you feeling confused.",mob,
            (void *)0x0,ch,2);
        name = "forget";
      }
      else {
        bVar1 = true;
        if (iVar2 == 0) {
          name = (char *)0x0;
          act("$n shows you the face of your worst nightmare, paralyzing you with fear!",mob,
              (void *)0x0,ch,2);
          act("$n\'s ghostly form flickers briefly as $N flinches away in terror.",mob,(void *)0x0,
              ch,1);
          LAG_CHAR(ch,0x24);
        }
      }
      if (!bVar1) {
        uVar3 = skill_lookup(name);
        if (-1 < (int)uVar3) {
          (*skill_table[uVar3].spell_fun)(uVar3,mob->level + 1,mob,ch,0);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void pulse_prog_phantasm(CHAR_DATA *mob)
{
	CHAR_DATA *victim = mob->fighting;
	int sn = 0;
	char *spell = nullptr;

	if (!victim || number_percent() > 10)
		return;

	switch (number_range(0, 5))
	{
		case 0:
			act("$n shows you the face of your worst nightmare, paralyzing you with fear!", mob, 0, victim, TO_VICT);
			act("$n's ghostly form flickers briefly as $N flinches away in terror.", mob, 0, victim, TO_NOTVICT);

			LAG_CHAR(victim, PULSE_VIOLENCE * 3);
			break;
		case 1:
		case 2:
		case 3:
			act("Your death flashes before your eyes.", 0, 0, victim, TO_VICT);
			act("You feel hope slip away.", 0, 0, victim, TO_VICT);
			act("$N gets a look of hopelessness on $S face.", mob, 0, victim, TO_NOTVICT);

			spell = "curse";
			break;
		case 4:
		case 5:
			act("$n runs $s fingers down $N's face gently.", mob, 0, victim, TO_NOTVICT);
			act("$n runs $s fingers down your face gently.", mob, 0, victim, TO_VICT);
			act("$n plunges $s spectral hand into $N's head, leaving $M looking confused.", mob, 0, victim, TO_NOTVICT);
			act("$n plunges $s spectral hand into your head, leaving you feeling confused.", mob, 0, victim, TO_VICT);

			spell = "forget";
			break;
	}

	if (!spell || (sn = skill_lookup(spell)) < 0)
		return;

	(*skill_table[sn].spell_fun)(sn, mob->level + 1, mob, victim, TARGET_CHAR);
}